

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultNamerFactory.cpp
# Opt level: O0

NamerCreator * ApprovalTests::DefaultNamerFactory::defaultNamer(void)

{
  int iVar1;
  anon_class_1_0_00000001 *in_stack_00000008;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *in_stack_00000010;
  
  if (defaultNamer()::namer == '\0') {
    iVar1 = __cxa_guard_acquire(&defaultNamer()::namer);
    if (iVar1 != 0) {
      ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>()>::
      function<ApprovalTests::DefaultNamerFactory::defaultNamer()::__0,void>
                (in_stack_00000010,in_stack_00000008);
      __cxa_atexit(::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::~function,
                   &defaultNamer::namer,&__dso_handle);
      __cxa_guard_release(&defaultNamer()::namer);
    }
  }
  return &defaultNamer::namer;
}

Assistant:

NamerCreator& DefaultNamerFactory::defaultNamer()
    {
        static NamerCreator namer = []() {
            return std::make_shared<ApprovalTestNamer>();
        };
        return namer;
    }